

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
::
Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
::next_raw(optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,
          Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
          *this,bool all_cofacets)

{
  int n;
  simplex_t sVar1;
  bool bVar2;
  simplex_t sVar3;
  logic_error *this_00;
  reference piVar4;
  float *pfVar5;
  diameter_entry_t dVar6;
  diameter_entry_t local_78;
  coefficient_t local_64;
  simplex_t sStack_60;
  coefficient_t cofacet_coefficient;
  simplex_t cofacet_index;
  iterator iStack_50;
  vertex_t i;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range4;
  value_t cofacet_diameter;
  undefined1 local_21;
  logic_error *local_20;
  undefined1 local_11;
  Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
  *pSStack_10;
  bool all_cofacets_local;
  Simplex_coboundary_enumerator_<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Tag_dense>
  *this_local;
  
  local_11 = all_cofacets;
  pSStack_10 = this;
  bVar2 = has_next(this,all_cofacets);
  if (bVar2) {
    while (sVar3 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::
                   operator()(this->simplex_encoding,this->j,this->k), sVar3 <= this->idx_below) {
      sVar3 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::operator()
                        (this->simplex_encoding,this->j,this->k);
      this->idx_below = this->idx_below - sVar3;
      sVar3 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::operator()
                        (this->simplex_encoding,this->j,this->k + '\x01');
      this->idx_above = sVar3 + this->idx_above;
      this->j = this->j + -1;
      this->k = this->k + -1;
      local_21 = 0;
      if (this->k == -1) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        local_21 = 1;
        local_20 = this_00;
        std::logic_error::logic_error(this_00,"");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    __range4._0_4_ = ripser::get_diameter(&this->simplex);
    __end0 = std::vector<int,_std::allocator<int>_>::begin(&this->vertices);
    iStack_50 = std::vector<int,_std::allocator<int>_>::end(&this->vertices);
    while (bVar2 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffb0), bVar2) {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end0);
      cofacet_index._4_4_ = *piVar4;
      cofacet_index._0_4_ =
           Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>::
           operator()(this->dist,this->j,cofacet_index._4_4_);
      pfVar5 = std::max<float>((float *)&__range4,(float *)&cofacet_index);
      __range4._0_4_ = *pfVar5;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end0);
    }
    sVar1 = this->idx_above;
    n = this->j;
    this->j = n + -1;
    sVar3 = Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::operator()
                      (this->simplex_encoding,n,this->k + '\x01');
    sStack_60 = sVar1 + sVar3 + this->idx_below;
    local_64 = Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
               ::get_coefficient(this->parent,&this->simplex);
    if ((this->k & 1U) != 0) {
      local_64 = this->parent->modulus - local_64;
    }
    dVar6 = Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>
            ::make_diameter_entry(this->parent,__range4._0_4_,sStack_60,local_64);
    local_78.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
    .second = dVar6.
              super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
              .second.content;
    local_78.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
    .first = dVar6.
             super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::entry_with_coeff_t>
             .first;
    std::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
    ::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t,_true>
              (__return_storage_ptr__,&local_78);
  }
  else {
    std::
    optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned_long,_float>_>,_Gudhi::ripser::TParams<true,_unsigned_long,_float>_>::diameter_entry_t>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next_raw(bool all_cofacets = true) {
      if (!has_next(all_cofacets)) return std::nullopt;
      // this requires simplex_encoding(x,0)>0
      while (simplex_encoding(j, k) <= idx_below) {
        idx_below -= simplex_encoding(j, k);
        idx_above += simplex_encoding(j, k + 1);
        --j;
        --k;
        GUDHI_assert(k != -1);
      }
      value_t cofacet_diameter = get_diameter(simplex);
      // The order of j and i matters for performance
      for (vertex_t i : vertices) cofacet_diameter = std::max(cofacet_diameter, dist(j, i));
      simplex_t cofacet_index = idx_above + simplex_encoding(j--, k + 1) + idx_below;
      coefficient_t cofacet_coefficient = parent.get_coefficient(simplex);
      if (k & 1) cofacet_coefficient = parent.modulus - cofacet_coefficient;
      return parent.make_diameter_entry(cofacet_diameter, cofacet_index, cofacet_coefficient);
    }